

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O2

bool __thiscall
draco::AttributeQuantizationTransform::InverseTransformAttribute
          (AttributeQuantizationTransform *this,PointAttribute *attribute,
          PointAttribute *target_attribute)

{
  byte bVar1;
  int32_t iVar2;
  ValueType VVar3;
  long lVar4;
  long lVar5;
  pointer pfVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  ValueType VVar10;
  long lVar11;
  ulong __n;
  Dequantizer dequantizer;
  unique_ptr<float[],_std::default_delete<float[]>_> att_val;
  
  if ((target_attribute->super_GeometryAttribute).data_type_ == DT_FLOAT32) {
    iVar2 = this->quantization_bits_;
    bVar1 = (target_attribute->super_GeometryAttribute).num_components_;
    __n = (ulong)((uint)bVar1 * 4);
    att_val._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(__n);
    Dequantizer::Dequantizer(&dequantizer);
    bVar7 = Dequantizer::Init(&dequantizer,this->range_,~(-1 << ((byte)iVar2 & 0x1f)));
    if (bVar7) {
      lVar4 = (long)(((attribute->super_GeometryAttribute).buffer_)->data_).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      lVar5 = (attribute->super_GeometryAttribute).byte_offset_;
      VVar3 = target_attribute->num_unique_entries_;
      lVar11 = 0;
      lVar8 = 0;
      for (VVar10 = 0; VVar10 != VVar3; VVar10 = VVar10 + 1) {
        pfVar6 = (this->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar9 = 0; bVar1 != uVar9; uVar9 = uVar9 + 1) {
          *(float *)((long)att_val._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                           _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                           super__Head_base<0UL,_float_*,_false>._M_head_impl + uVar9 * 4) =
               (float)*(int *)(lVar4 + lVar5 + (long)(int)lVar8 * 4 + uVar9 * 4) *
               dequantizer.delta_ + pfVar6[uVar9];
        }
        memcpy((void *)(*(long *)&(((target_attribute->attribute_buffer_)._M_t.
                                    super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
                                    .super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl)
                                  ->data_).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       + lVar11),
               (void *)att_val._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t
                       .super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                       super__Head_base<0UL,_float_*,_false>._M_head_impl,__n);
        lVar11 = lVar11 + __n;
        lVar8 = (long)(int)lVar8 + uVar9;
      }
    }
    std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&att_val);
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool AttributeQuantizationTransform::InverseTransformAttribute(
    const PointAttribute &attribute, PointAttribute *target_attribute) {
  if (target_attribute->data_type() != DT_FLOAT32) {
    return false;
  }

  // Convert all quantized values back to floats.
  const int32_t max_quantized_value =
      (1u << static_cast<uint32_t>(quantization_bits_)) - 1;
  const int num_components = target_attribute->num_components();
  const int entry_size = sizeof(float) * num_components;
  const std::unique_ptr<float[]> att_val(new float[num_components]);
  int quant_val_id = 0;
  int out_byte_pos = 0;
  Dequantizer dequantizer;
  if (!dequantizer.Init(range_, max_quantized_value)) {
    return false;
  }
  const int32_t *const source_attribute_data =
      reinterpret_cast<const int32_t *>(
          attribute.GetAddress(AttributeValueIndex(0)));

  const int num_values = target_attribute->size();

  for (uint32_t i = 0; i < num_values; ++i) {
    for (int c = 0; c < num_components; ++c) {
      float value =
          dequantizer.DequantizeFloat(source_attribute_data[quant_val_id++]);
      value = value + min_values_[c];
      att_val[c] = value;
    }
    // Store the floating point value into the attribute buffer.
    target_attribute->buffer()->Write(out_byte_pos, att_val.get(), entry_size);
    out_byte_pos += entry_size;
  }
  return true;
}